

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::handle_disk_error
          (torrent *this,string_view job_name,storage_error *error,peer_connection *c,disk_class rw)

{
  peer_connection_hot_members *ppVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  peer_connection *ppVar3;
  bool bVar4;
  uint uVar5;
  undefined8 uVar6;
  size_type sVar7;
  const_pointer pvVar8;
  char *pcVar9;
  undefined8 uVar10;
  alert_manager *paVar11;
  bool local_21a;
  bool local_219;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> local_18d;
  int local_18c;
  error_condition local_188;
  error_condition local_178;
  error_condition local_168;
  error_condition local_158;
  error_condition local_148;
  undefined1 local_138 [24];
  string local_120;
  error_code local_100;
  undefined1 local_e9;
  error_code local_e8;
  undefined1 local_d8 [24];
  string local_c0;
  error_condition local_a0;
  int local_8c;
  string local_88;
  string local_58;
  disk_class local_34;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  disk_class rw_local;
  peer_connection *c_local;
  storage_error *error_local;
  torrent *this_local;
  string_view job_name_local;
  
  job_name_local._M_len = (size_t)job_name._M_str;
  this_local = (torrent *)job_name._M_len;
  local_34 = rw;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)c;
  c_local = (peer_connection *)error;
  error_local = (storage_error *)this;
  uVar5 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((uVar5 & 1) != 0) {
    uVar5 = boost::system::error_code::value((error_code *)c_local);
    boost::system::error_code::message_abi_cxx11_(&local_58,(error_code *)c_local);
    uVar6 = ::std::__cxx11::string::c_str();
    sVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pvVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pcVar9 = operation_name(*(operation_t *)
                             ((long)&(c_local->super_peer_connection_hot_members).m_torrent.
                                     super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 3));
    local_8c = (int)storage_error::file((storage_error *)c_local);
    resolve_filename_abi_cxx11_(&local_88,this,(file_index_t)local_8c);
    uVar10 = ::std::__cxx11::string::c_str();
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"disk error: (%d) %s [%*s : %s] in file: %s",(ulong)uVar5,uVar6,
               sVar7 & 0xffffffff,pvVar8,pcVar9,uVar10);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  ppVar3 = c_local;
  boost::system::error_condition::error_condition<boost::system::errc::errc_t>
            (&local_a0,not_enough_memory,(type *)0x0);
  bVar4 = boost::system::operator==((error_code *)ppVar3,&local_a0);
  ppVar3 = c_local;
  if (bVar4) {
    paVar11 = alerts(this);
    bVar4 = alert_manager::should_post<libtorrent::file_error_alert>(paVar11);
    if (bVar4) {
      paVar11 = alerts(this);
      ppVar3 = c_local;
      local_d8._20_4_ = storage_error::file((storage_error *)c_local);
      resolve_filename_abi_cxx11_(&local_c0,this,(file_index_t)local_d8._20_4_);
      ppVar1 = &c_local->super_peer_connection_hot_members;
      get_handle((torrent *)local_d8);
      alert_manager::
      emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                (paVar11,(error_code *)ppVar3,&local_c0,
                 (operation_t *)
                 ((long)&(ppVar1->m_torrent).
                         super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 3),(torrent_handle *)local_d8);
      torrent_handle::~torrent_handle((torrent_handle *)local_d8);
      ::std::__cxx11::string::~string((string *)&local_c0);
    }
    _Var2._M_pi = _Stack_30._M_pi;
    if ((peer_connection *)_Stack_30._M_pi != (peer_connection *)0x0) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_e8,no_memory,(type *)0x0);
      local_e9 = 0;
      (*((bandwidth_socket *)&(_Var2._M_pi)->_vptr__Sp_counted_base)->_vptr_bandwidth_socket[0x14])
                (_Var2._M_pi,&local_e8,
                 (ulong)*(byte *)((long)&(c_local->super_peer_connection_hot_members).m_torrent.
                                         super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 3),0);
    }
  }
  else {
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              (&local_100,operation_aborted,(type *)0x0);
    bVar4 = boost::system::operator==((error_code *)ppVar3,&local_100);
    if (!bVar4) {
      paVar11 = alerts(this);
      bVar4 = alert_manager::should_post<libtorrent::file_error_alert>(paVar11);
      if (bVar4) {
        paVar11 = alerts(this);
        ppVar3 = c_local;
        local_138._20_4_ = storage_error::file((storage_error *)c_local);
        resolve_filename_abi_cxx11_
                  ((string *)(local_138 + 0x18),this,(file_index_t)local_138._20_4_);
        ppVar1 = &c_local->super_peer_connection_hot_members;
        get_handle((torrent *)local_138);
        alert_manager::
        emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                  (paVar11,(error_code *)ppVar3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_138 + 0x18),
                   (operation_t *)
                   ((long)&(ppVar1->m_torrent).
                           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 3),(torrent_handle *)local_138);
        torrent_handle::~torrent_handle((torrent_handle *)local_138);
        ::std::__cxx11::string::~string((string *)(local_138 + 0x18));
      }
      ppVar3 = c_local;
      local_219 = false;
      if (local_34 == write) {
        boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                  (&local_148,read_only_file_system,(type *)0x0);
        bVar4 = boost::system::operator==((error_code *)ppVar3,&local_148);
        ppVar3 = c_local;
        local_21a = true;
        if (!bVar4) {
          boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                    (&local_158,permission_denied,(type *)0x0);
          bVar4 = boost::system::operator==((error_code *)ppVar3,&local_158);
          ppVar3 = c_local;
          local_21a = true;
          if (!bVar4) {
            boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                      (&local_168,operation_not_permitted,(type *)0x0);
            bVar4 = boost::system::operator==((error_code *)ppVar3,&local_168);
            ppVar3 = c_local;
            local_21a = true;
            if (!bVar4) {
              boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                        (&local_178,no_space_on_device,(type *)0x0);
              bVar4 = boost::system::operator==((error_code *)ppVar3,&local_178);
              ppVar3 = c_local;
              local_21a = true;
              if (!bVar4) {
                boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                          (&local_188,file_too_large,(type *)0x0);
                local_21a = boost::system::operator==((error_code *)ppVar3,&local_188);
              }
            }
          }
        }
        local_219 = local_21a;
      }
      ppVar3 = c_local;
      if (local_219 == false) {
        local_18c = (int)storage_error::file((storage_error *)c_local);
        set_error(this,(error_code *)ppVar3,(file_index_t)local_18c);
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
        bitfield_flag(&local_18d);
        pause(this);
      }
      else {
        set_upload_mode(this,true);
      }
    }
  }
  return;
}

Assistant:

void torrent::handle_disk_error(string_view job_name
		, storage_error const& error
		, peer_connection* c
		, disk_class rw)
	{
		TORRENT_UNUSED(job_name);
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(error);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("disk error: (%d) %s [%*s : %s] in file: %s"
				, error.ec.value(), error.ec.message().c_str()
				, int(job_name.size()), job_name.data()
				, operation_name(error.operation)
				, resolve_filename(error.file()).c_str());
		}
#endif

		if (error.ec == boost::system::errc::not_enough_memory)
		{
			if (alerts().should_post<file_error_alert>())
				alerts().emplace_alert<file_error_alert>(error.ec
					, resolve_filename(error.file()), error.operation, get_handle());
			if (c) c->disconnect(errors::no_memory, error.operation);
			return;
		}

		if (error.ec == boost::asio::error::operation_aborted) return;

		// notify the user of the error
		if (alerts().should_post<file_error_alert>())
			alerts().emplace_alert<file_error_alert>(error.ec
				, resolve_filename(error.file()), error.operation, get_handle());

		// if a write operation failed, and future writes are likely to
		// fail, while reads may succeed, just set the torrent to upload mode
		// if we make an incorrect assumption here, it's not the end of the
		// world, if we ever issue a read request and it fails as well, we
		// won't get in here and we'll actually end up pausing the torrent
		if (rw == disk_class::write
			&& (error.ec == boost::system::errc::read_only_file_system
			|| error.ec == boost::system::errc::permission_denied
			|| error.ec == boost::system::errc::operation_not_permitted
			|| error.ec == boost::system::errc::no_space_on_device
			|| error.ec == boost::system::errc::file_too_large))
		{
			// if we failed to write, stop downloading and just
			// keep seeding.
			// TODO: 1 make this depend on the error and on the filesystem the
			// files are being downloaded to. If the error is no_space_left_on_device
			// and the filesystem doesn't support sparse files, only zero the priorities
			// of the pieces that are at the tails of all files, leaving everything
			// up to the highest written piece in each file
			set_upload_mode(true);
			return;
		}

		// put the torrent in an error-state
		set_error(error.ec, error.file());

		// if the error appears to be more serious than a full disk, just pause the torrent
		pause();
	}